

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O2

bool __thiscall
PageStack<FinalizableObject_*>::Pop(PageStack<FinalizableObject_*> *this,FinalizableObject **item)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Chunk *pCVar4;
  Chunk *pCVar5;
  size_t sVar6;
  Chunk *pCVar7;
  
  if (this->currentChunk == (Chunk *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x4b,"(currentChunk != nullptr)","currentChunk != nullptr");
    if (!bVar2) goto LAB_00666a6e;
    *puVar3 = 0;
  }
  pCVar4 = (Chunk *)this->nextEntry;
  pCVar7 = (Chunk *)this->chunkStart;
  if (pCVar4 == pCVar7) {
    pCVar7 = this->currentChunk;
    pCVar4 = pCVar7->nextChunk;
    if (pCVar4 == (Chunk *)0x0) {
      if (this->count == 0) {
        return false;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                         ,0x53,"(count == 0)","count == 0");
      if (!bVar2) goto LAB_00666a6e;
      bVar2 = false;
      goto LAB_00666a09;
    }
    this->currentChunk = pCVar4;
    FreeChunk(this,pCVar7);
    pCVar7 = this->currentChunk + 1;
    this->chunkStart = (FinalizableObject **)pCVar7;
    pCVar4 = this->currentChunk + 0x80;
    this->chunkEnd = (FinalizableObject **)pCVar4;
    this->nextEntry = (FinalizableObject **)pCVar4;
    pCVar5 = pCVar4;
  }
  else {
    pCVar5 = (Chunk *)this->chunkEnd;
  }
  if ((pCVar4 <= pCVar7) || (pCVar5 < pCVar4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x60,"(nextEntry > chunkStart && nextEntry <= chunkEnd)",
                       "nextEntry > chunkStart && nextEntry <= chunkEnd");
    if (!bVar2) goto LAB_00666a6e;
    *puVar3 = 0;
    pCVar4 = (Chunk *)this->nextEntry;
  }
  this->nextEntry = (FinalizableObject **)&pCVar4[-1].nextChunk;
  *item = (FinalizableObject *)pCVar4[-1].nextChunk;
  sVar6 = this->count - 1;
  this->count = sVar6;
  if (sVar6 == (this->pageCount * 0x1fc + ((long)this->nextEntry - (long)this->chunkStart >> 3)) -
               0x1fc) {
    return true;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                     ,0x6a,"(count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk)"
                     ,"count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk");
  if (bVar2) {
    bVar2 = true;
LAB_00666a09:
    *puVar3 = 0;
    return bVar2;
  }
LAB_00666a6e:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

inline
bool PageStack<T>::Pop(T * item)
{
    Assert(currentChunk != nullptr);

    if (nextEntry == chunkStart)
    {
        // We're at the beginning of the chunk.  Move to the previous chunk, if any
        if (currentChunk->nextChunk == nullptr)
        {
            // All done
            Assert(count == 0);
            return false;
        }

        Chunk * temp = currentChunk;
        currentChunk = currentChunk->nextChunk;
        FreeChunk(temp);

        chunkStart = currentChunk->entries;
        chunkEnd = &currentChunk->entries[EntriesPerChunk];
        nextEntry = chunkEnd;
    }

    Assert(nextEntry > chunkStart && nextEntry <= chunkEnd);

    nextEntry--;
#if defined(_M_IX86) || defined(_M_X64)
    _mm_prefetch((char*) (nextEntry - 1), _MM_HINT_T0);
#endif
    *item = *nextEntry;

#if DBG
    count--;
    Assert(count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk);
#endif

    return true;
}